

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_Camera * GPU_SetCamera(GPU_Camera *__return_storage_ptr__,GPU_Target *target,GPU_Camera *cam)

{
  GPU_Target *pGVar1;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    pGVar1 = _gpu_current_renderer->current_context_target;
    if (target != (GPU_Target *)0x0 && pGVar1 == (GPU_Target *)0x0) {
      if (target->context == (GPU_Context *)0x0) goto LAB_00137254;
      GPU_MakeCurrent(target,target->context->windowID);
      pGVar1 = _gpu_current_renderer->current_context_target;
    }
    if (pGVar1 != (GPU_Target *)0x0) {
      (*_gpu_current_renderer->impl->SetCamera)
                (__return_storage_ptr__,_gpu_current_renderer,target,cam);
      return __return_storage_ptr__;
    }
  }
LAB_00137254:
  __return_storage_ptr__->angle = 0.0;
  __return_storage_ptr__->zoom = 1.0;
  __return_storage_ptr__->z_near = -100.0;
  __return_storage_ptr__->z_far = 100.0;
  __return_storage_ptr__->x = 0.0;
  __return_storage_ptr__->y = 0.0;
  __return_storage_ptr__->z = 0.0;
  __return_storage_ptr__->angle = 0.0;
  return __return_storage_ptr__;
}

Assistant:

GPU_Camera GPU_SetCamera(GPU_Target* target, GPU_Camera* cam)
{
    if(_gpu_current_renderer == NULL)
        return GPU_GetDefaultCamera();
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return GPU_GetDefaultCamera();
	// TODO: Remove from renderer and flush here
    return _gpu_current_renderer->impl->SetCamera(_gpu_current_renderer, target, cam);
}